

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void metaiterator_advance(char **title,char **value)

{
  char *pcVar1;
  char **value_local;
  char **title_local;
  
  if ((*title == (char *)0x0) || (**title == '\0')) {
    *value = (char *)0x0;
  }
  else {
    *value = *title;
    while (**value != '\0') {
      *value = *value + 1;
    }
    pcVar1 = *value;
    *value = pcVar1 + 1;
    if (pcVar1[1] == '=') {
      *value = *value + 1;
    }
    else {
      *value = (char *)0x0;
    }
  }
  return;
}

Assistant:

void metaiterator_advance(const char *&title, const char *&value)
{
    if(!title || !*title) {
        value = NULL;
        return;
    }

    //Try to find "\0=" after title string
    value = title;
    while(*value)
        ++value;
    if(*++value != '=')
        value = NULL;
    else
        value++;
}